

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingParameters.hpp
# Opt level: O3

Vector3f __thiscall eos::fitting::RenderingParameters::get_yaw_pitch_roll(RenderingParameters *this)

{
  undefined1 auVar1 [16];
  Matrix<float,_3,_1,_0,_3,_1> *res;
  long in_RSI;
  float fVar5;
  undefined1 auVar3 [16];
  float fVar6;
  undefined1 extraout_var [12];
  undefined1 auVar4 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  Vector3f VVar14;
  float local_78;
  undefined8 uVar2;
  
  auVar3 = *(undefined1 (*) [16])(in_RSI + 0x20);
  fVar7 = auVar3._12_4_ * auVar3._12_4_ + auVar3._4_4_ * auVar3._4_4_ +
          auVar3._8_4_ * auVar3._8_4_ + auVar3._0_4_ * auVar3._0_4_;
  if (0.0 < fVar7) {
    fVar7 = SQRT(fVar7);
    auVar1._4_4_ = fVar7;
    auVar1._0_4_ = fVar7;
    auVar1._8_4_ = fVar7;
    auVar1._12_4_ = fVar7;
    auVar3 = divps(auVar3,auVar1);
  }
  fVar7 = auVar3._0_4_;
  auVar4._0_4_ = auVar3._4_4_;
  fVar5 = auVar3._8_4_;
  fVar6 = auVar3._12_4_;
  fVar10 = fVar5 + fVar5;
  fVar9 = auVar4._0_4_ + auVar4._0_4_;
  fVar11 = fVar6 * (fVar7 + fVar7);
  fVar8 = (fVar7 + fVar7) * fVar7;
  fVar13 = fVar9 * fVar7 + fVar6 * fVar10;
  fVar12 = 1.0 - (fVar10 * fVar5 + fVar8);
  local_78 = atan2f(fVar7 * fVar10 + fVar6 * fVar9,1.0 - (fVar9 * auVar4._0_4_ + fVar8));
  fVar8 = SQRT(fVar13 * fVar13 + fVar12 * fVar12);
  if (local_78 < 0.0) {
    local_78 = local_78 + 3.1415927;
    fVar8 = -fVar8;
  }
  fVar8 = atan2f(-(auVar4._0_4_ * fVar10 - fVar11),fVar8);
  fVar12 = sinf(local_78);
  fVar13 = cosf(local_78);
  auVar3._0_4_ = atan2f((auVar4._0_4_ * fVar10 + fVar11) * fVar12 -
                        (fVar9 * fVar7 - fVar6 * fVar10) * fVar13,
                        (1.0 - (fVar9 * auVar4._0_4_ + fVar10 * fVar5)) * fVar13 -
                        (fVar7 * fVar10 - fVar6 * fVar9) * fVar12);
  auVar3._4_12_ = extraout_var;
  uVar2 = auVar3._0_8_;
  fVar7 = ABS(fVar8);
  auVar4._0_4_ = auVar3._0_4_;
  if (1.5707964 < fVar7) {
    fVar7 = local_78;
    if (!NAN(local_78)) {
      fVar7 = (float)(int)((uint)(0.0 < local_78) - (uint)(local_78 < 0.0));
    }
    fVar7 = fVar7 * 3.1415927;
    if (!NAN(auVar3._0_4_)) {
      auVar4._0_4_ = (float)(int)((uint)(0.0 < auVar3._0_4_) - (uint)(auVar3._0_4_ < 0.0));
    }
    local_78 = local_78 - fVar7;
    auVar4._0_4_ = auVar3._0_4_ + auVar4._0_4_ * -3.1415927;
    auVar4._4_12_ = extraout_var;
    uVar2 = auVar4._0_8_;
    fVar8 = -(fVar8 - (float)(int)((uint)(0.0 < fVar8) - (uint)(fVar8 < 0.0)) * 3.1415927);
  }
  this->camera_type = (CameraType)(local_78 * 57.29578);
  (this->frustum).l = fVar8 * 57.29578;
  (this->frustum).r = auVar4._0_4_ * 57.29578;
  VVar14.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       fVar7;
  VVar14.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (float)(int)uVar2;
  VVar14.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (float)(int)((ulong)uVar2 >> 0x20);
  return (Vector3f)
         VVar14.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array;
}

Assistant:

Eigen::Vector3f get_yaw_pitch_roll()
    {
        // We use Eigen's Matrix3::eulerAngles() function with axes (1, 0, 2). In our coordinate system, the x
        // axis is to the right, y up, and z into/out of the screen. So to get yaw first, our first axis is y
        // ('1'), then our x axis ('0') to get pitch, then our z axis ('2') to get roll.
        // We are guessing that the function returns intrinsic angles (the unsupported EulerAngles() module
        // does, but it's an unrelated module).
        // Because eulerAngles() constrains the angles in a different way to what we want, we correct for
        // that in tait_bryan_angles() (which calls eulerAngles() and then modifies the solution accordingly).
        Eigen::Vector3f ea = fitting::tait_bryan_angles(rotation.normalized().toRotationMatrix(), 1, 0, 2);
        ea(0) = core::degrees(ea(0));
        ea(1) = core::degrees(ea(1));
        ea(2) = core::degrees(ea(2));
        return ea;
    }